

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

ErrorPolicy llvm::DWARFContext::defaultErrorHandler(Error *E)

{
  raw_ostream *prVar1;
  Error *E_00;
  string local_40;
  ulong local_20;
  
  prVar1 = WithColor::error();
  local_20 = (ulong)E->Payload | 1;
  E->Payload = (ErrorInfoBase *)0x0;
  toString_abi_cxx11_(&local_40,(llvm *)&local_20,E_00);
  prVar1 = raw_ostream::operator<<(prVar1,&local_40);
  raw_ostream::operator<<(prVar1,'\n');
  std::__cxx11::string::~string((string *)&local_40);
  if ((long *)(local_20 & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(local_20 & 0xfffffffffffffffe) + 8))();
  }
  return Continue;
}

Assistant:

ErrorPolicy DWARFContext::defaultErrorHandler(Error E) {
  WithColor::error() << toString(std::move(E)) << '\n';
  return ErrorPolicy::Continue;
}